

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O1

void Fraig_FeedBackCheckTableF0(Fraig_Man_t *p)

{
  Fraig_HashTable_t *pFVar1;
  Fraig_Node_t **ppFVar2;
  int iVar3;
  Fraig_NodeVec_t *pFVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Fraig_Node_t *Entry;
  long lVar9;
  
  pFVar1 = p->pTableF0;
  if (0 < pFVar1->nBins) {
    lVar5 = 0;
    do {
      p->vCones->nSize = 0;
      for (Entry = pFVar1->pBins[lVar5]; Entry != (Fraig_Node_t *)0x0; Entry = Entry->pNextF) {
        Fraig_NodeVecPush(p->vCones,Entry);
      }
      if ((p->vCones->nSize != 1) && (0 < p->vCones->nSize)) {
        lVar8 = 1;
        lVar6 = 0;
        do {
          lVar7 = lVar6 + 1;
          pFVar4 = p->vCones;
          lVar9 = lVar8;
          if (lVar7 < pFVar4->nSize) {
            do {
              iVar3 = Fraig_CompareSimInfo
                                (pFVar4->pArray[lVar6],pFVar4->pArray[lVar9],p->iWordStart,0);
              if (iVar3 != 0) {
                ppFVar2 = p->vCones->pArray;
                printf("Nodes %d and %d have the same D simulation info.\n",
                       (ulong)(uint)ppFVar2[lVar6]->Num,(ulong)(uint)ppFVar2[lVar9]->Num);
              }
              lVar9 = lVar9 + 1;
              pFVar4 = p->vCones;
            } while ((int)lVar9 < pFVar4->nSize);
          }
          lVar8 = lVar8 + 1;
          lVar6 = lVar7;
        } while (lVar7 < p->vCones->nSize);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pFVar1->nBins);
  }
  return;
}

Assistant:

void Fraig_FeedBackCheckTableF0( Fraig_Man_t * p )
{
    Fraig_HashTable_t * pT = p->pTableF0;
    Fraig_Node_t * pEntF;
    int i, k, m, nPairs;

    nPairs = 0;
    for ( i = 0; i < pT->nBins; i++ )
    {
        p->vCones->nSize = 0;
        Fraig_TableBinForEachEntryF( pT->pBins[i], pEntF )
            Fraig_NodeVecPush( p->vCones, pEntF );
        if ( p->vCones->nSize == 1 )
            continue;
        for ( k = 0; k < p->vCones->nSize; k++ )
            for ( m = k+1; m < p->vCones->nSize; m++ )
            {
                if ( Fraig_CompareSimInfo( p->vCones->pArray[k], p->vCones->pArray[m], p->iWordStart, 0 ) )
                    printf( "Nodes %d and %d have the same D simulation info.\n", 
                        p->vCones->pArray[k]->Num, p->vCones->pArray[m]->Num );
                nPairs++;
            }   
    }
//    printf( "\nThe total of %d node pairs have been verified.\n", nPairs );
}